

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_generator.cpp
# Opt level: O2

void __thiscall franca::ModelGenerator::ModelGenerator(ModelGenerator *this)

{
  karma_rule<fidler::ast::Model_()> *this_00;
  string *this_01;
  AnnotationGenerator *pAVar1;
  karma_rule<std::string_()> *this_02;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  karma_rule<fidler::ast::Interface_()> *this_03;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>
  that_5;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>
  that_6;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>
  that_4;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>
  that_3;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>
  that_1;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>
  that;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>
  that_2;
  proto_child0 local_238;
  TypeGenerator *local_230;
  string local_228;
  TypeGenerator *local_208;
  proto_child0 local_200;
  TypeGenerator **local_1f8;
  proto_child0 local_1f0;
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_1e8;
  TypeGenerator *local_1e0;
  undefined1 local_1d8 [24];
  char *local_1c0;
  AnnotationGenerator *local_1b8;
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  char *local_188;
  char *local_180;
  undefined1 local_178 [32];
  undefined1 local_158 [24];
  undefined1 local_140 [16];
  undefined1 local_130 [56];
  _Alloc_hider local_f8;
  undefined1 local_f0 [24];
  function_buffer local_d8;
  AnnotationGenerator *local_c0;
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Attribute_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_b8;
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Version_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  char *local_a0;
  proto_child0 local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  karma_rule<std::string_()> *local_80;
  karma_rule<fidler::ast::Model_()> *local_78;
  string *local_70;
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Attribute_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  **local_68;
  char *local_60;
  reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
  local_58;
  TypeDefinitionGenerator *local_50;
  ContractGenerator *local_48;
  ContractGenerator *local_40;
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Method_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_38;
  
  std::__cxx11::string::string((string *)&local_228,"unnamed-grammar",(allocator *)&local_238);
  this_00 = &this->model_;
  (this->super_karma_grammar<fidler::ast::Model_()>).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::grammar<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = this_00;
  this_01 = &(this->super_karma_grammar<fidler::ast::Model_()>).name_;
  std::__cxx11::string::string((string *)this_01,(string *)&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  local_70 = this_01;
  std::__cxx11::string::string((string *)&local_228,"unnamed-rule",(allocator *)&local_238);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(this_00,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  pAVar1 = &this->annotation_;
  local_78 = this_00;
  AnnotationGenerator::AnnotationGenerator(pAVar1);
  local_c0 = pAVar1;
  TypeGenerator::TypeGenerator(&this->type_);
  local_140._0_8_ = &this->type_;
  TypeDefinitionGenerator::TypeDefinitionGenerator(&this->type_definition_);
  local_d8._8_8_ = &this->initializer_;
  local_140._8_8_ = &this->type_definition_;
  InitializerGenerator::InitializerGenerator((InitializerGenerator *)local_d8._8_8_);
  local_d8._16_8_ = &this->contract_;
  ContractGenerator::ContractGenerator((ContractGenerator *)local_d8._16_8_);
  local_d8.members.obj_ptr = &this->expression_;
  ExpressionGenerator::ExpressionGenerator((ExpressionGenerator *)local_d8.members._0_8_);
  std::__cxx11::string::string((string *)&local_228,"unnamed-rule",(allocator *)&local_238);
  this_02 = &this->import_;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(this_02,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  local_80 = this_02;
  std::__cxx11::string::string((string *)&local_228,"unnamed-rule",(allocator *)&local_238);
  local_158._16_8_ = &this->version_;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Version_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule((rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Version_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_158._16_8_,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::string((string *)&local_228,"unnamed-rule",(allocator *)&local_238);
  local_158._8_8_ = &this->attribute_;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Attribute_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule((rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Attribute_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_158._8_8_,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::string((string *)&local_228,"unnamed-rule",(allocator *)&local_238);
  local_f0._16_8_ = &this->argument_;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule((rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_f0._16_8_,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::string((string *)&local_228,"unnamed-rule",(allocator *)&local_238);
  local_178._8_8_ = &this->argument_list_;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<fidler::ast::Argument,_std::allocator<fidler::ast::Argument>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule((rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<fidler::ast::Argument,_std::allocator<fidler::ast::Argument>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_178._8_8_,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::string((string *)&local_228,"unnamed-rule",(allocator *)&local_238);
  local_f0._8_8_ = &this->error_;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<fidler::ast::Enumerator,_std::allocator<fidler::ast::Enumerator>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule((rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<fidler::ast::Enumerator,_std::allocator<fidler::ast::Enumerator>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_f0._8_8_,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::string((string *)&local_228,"unnamed-rule",(allocator *)&local_238);
  local_f0._0_8_ = &this->enumerator_;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule((rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_f0._0_8_,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::string((string *)&local_228,"unnamed-rule",(allocator *)&local_238);
  local_158._0_8_ = &this->method_;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Method_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule((rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Method_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_158._0_8_,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::string((string *)&local_228,"unnamed-rule",(allocator *)&local_238);
  local_178._16_8_ = &this->broadcast_;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Broadcast_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule((rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Broadcast_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_178._16_8_,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::string((string *)&local_228,"unnamed-rule",(allocator *)&local_238);
  local_178._0_8_ = &this->constant_def_;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ConstantDef_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule((rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ConstantDef_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_178._0_8_,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::string((string *)&local_228,"unnamed-rule",(allocator *)&local_238);
  local_178._24_8_ = &this->type_collection_;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule((rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_178._24_8_,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::string((string *)&local_228,"unnamed-rule",(allocator *)&local_238);
  this_03 = &this->interface_;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Interface_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(this_03,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  local_208 = (TypeGenerator *)local_1d8;
  local_1d8._0_8_ = "package ";
  local_1d8._8_8_ = &boost::spirit::standard::string;
  local_1f8 = &local_208;
  local_200.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)0x61a7d1;
  local_1f0.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_1e8;
  local_238.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_1f8;
  local_230 = (TypeGenerator *)(local_1d8 + 0x10);
  local_1d8._16_8_ = local_178._24_8_;
  local_228._M_string_length = (size_type)&local_1b8;
  local_228._M_dataplus._M_p = (pointer)&local_238;
  local_1e8 = this_02;
  local_1b8 = (AnnotationGenerator *)this_03;
  local_f8._M_p = (pointer)this_03;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Model(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[9]>,0l>,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[2]>,0l>>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,char,std::char_traits<char>>,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::TypeCollection(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Interface(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,1l>const&>,2l>>
            (this_00,&local_228);
  local_238.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)0x610cc1;
  local_230 = (TypeGenerator *)&boost::spirit::standard::string;
  local_228._M_string_length = 0x610cd5;
  local_228._M_dataplus._M_p = (pointer)&local_238;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[20]>,0l>,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[3]>,0l>>,2l>>
            (this_02);
  local_1c0 = "typeCollection";
  local_130[0] = 0x20;
  local_1b0.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&boost::spirit::standard::string;
  local_1e0 = (TypeGenerator *)local_198;
  local_198._0_8_ = &local_1b8;
  local_1e8 = (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)(local_1d8 + 0x10);
  local_1d8._0_8_ = &local_1e8;
  local_1d8._8_8_ = "\n{\n";
  local_1a8._0_8_ = "  ";
  local_1a8._8_8_ = local_158._16_8_;
  local_208 = (TypeGenerator *)local_1d8;
  local_130._24_8_ = local_140._8_8_;
  local_1f8 = &local_208;
  local_130._40_8_ = local_178._0_8_;
  local_238.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_1f8;
  local_228._M_string_length = 0x61cf88;
  local_230 = (TypeGenerator *)(local_130 + 0x28);
  local_228._M_dataplus._M_p = (pointer)&local_238;
  local_200.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_188;
  local_1f0.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )(local_130 + 0x18);
  local_1d8._16_8_ = pAVar1;
  local_1b8 = (AnnotationGenerator *)local_130;
  local_188 = (char *)local_1a8;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::TypeCollection(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<franca::AnnotationGenerator&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[15]>,0l>>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_lef___s_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[3]>,0l>>,2l>>
            (local_178._24_8_);
  uVar2 = local_158._16_8_;
  local_130._48_8_ = "interface ";
  local_130._32_8_ = &boost::spirit::standard::string;
  local_130._0_8_ = " extends ";
  local_130._8_8_ = &boost::spirit::standard::string;
  local_180 = (char *)((long)local_130 + 0x10);
  local_68 = (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Attribute_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
              **)&boost::spirit::standard::string;
  local_60 = ", ";
  local_a0 = " manages ";
  local_90._M_allocated_capacity = (size_type)&boost::spirit::buffer;
  local_198._8_8_ = &local_a8;
  local_1a8._0_8_ = local_198;
  local_1a8._8_8_ = "\n{\n";
  local_1b0.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&local_b0;
  local_b0 = (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Version_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
              *)local_158._16_8_;
  local_1e0 = (TypeGenerator *)&local_38;
  local_38 = (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Method_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
              *)local_158._0_8_;
  local_1e8 = (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)(local_1d8 + 0x10);
  local_1d8._8_8_ = &local_40;
  local_40 = (ContractGenerator *)local_178._16_8_;
  local_1d8._0_8_ = &local_1e8;
  local_200.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_48;
  local_48 = (ContractGenerator *)local_d8._16_8_;
  local_208 = (TypeGenerator *)local_1d8;
  local_1f0.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_50;
  local_50 = (TypeDefinitionGenerator *)local_140._8_8_;
  local_230 = (TypeGenerator *)&local_58;
  local_58.t_ = (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
                 *)local_178._0_8_;
  local_228._M_string_length = 0x61cf88;
  local_1c0 = (char *)&local_b8;
  local_b8 = (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Attribute_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
              *)local_158._8_8_;
  local_1d8._16_8_ = &local_1b8;
  local_238.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_1f8;
  local_228._M_dataplus._M_p = (pointer)&local_238;
  local_1f8 = &local_208;
  local_1b8 = (AnnotationGenerator *)local_1a8;
  local_198._0_8_ = &local_188;
  local_188 = local_130 + 0x18;
  local_130._16_8_ = local_130;
  local_130._24_8_ = local_130 + 0x28;
  local_130._40_8_ = pAVar1;
  local_a8 = &local_90;
  local_98.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_68;
  local_90._8_8_ = &local_a0;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Interface_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::define<_ddf622d3_>(local_f8._M_p);
  local_208 = (TypeGenerator *)0x610d0d;
  local_200.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&boost::spirit::int_;
  local_1f0.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)0x610d20;
  local_230 = (TypeGenerator *)&boost::spirit::int_;
  local_228._M_string_length = 0x61cf87;
  local_238.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)&local_1f8;
  local_228._M_dataplus._M_p = (pointer)&local_238;
  local_1f8 = &local_208;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Version(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[19]>,0l>,boost::spirit::terminal<boost::spirit::tag::int_>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[8]>,0l>>,2l>const&,boost::spirit::terminal<boost::spirit::tag::int_>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[4]>,0l>>,2l>>
            (uVar2);
  pAVar1 = local_c0;
  uVar2 = local_f0._0_8_;
  local_1b8 = local_c0;
  local_1b0.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )(proto_child0)0x610d28;
  local_1d8._16_8_ = &local_1b8;
  local_1c0 = (char *)local_140._0_8_;
  local_90._M_local_buf[0] = 1;
  local_1a8._0_8_ = (long)local_130 + 0x18;
  local_1a8._8_8_ = "[]";
  local_1e8 = (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)(local_1d8 + 0x10);
  local_1e0 = (TypeGenerator *)local_1a8;
  local_130[0x10] = 0x20;
  local_1d8._0_8_ = &local_1e8;
  local_208 = (TypeGenerator *)local_1d8;
  local_200.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&boost::spirit::standard::string;
  local_a0 = (char *)CONCAT71(local_a0._1_7_,1);
  local_198._8_8_ = " readonly";
  local_1f0.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )local_198;
  local_68 = (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Attribute_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
              **)CONCAT71(local_68._1_7_,1);
  local_188 = local_130;
  local_180 = " noSubscriptions";
  local_238.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_1f8;
  local_228._M_string_length = (size_type)&boost::spirit::eol;
  local_230 = (TypeGenerator *)&local_188;
  local_228._M_dataplus._M_p = (pointer)&local_238;
  local_1f8 = &local_208;
  local_1d8._8_8_ = local_130 + 0x10;
  local_198._0_8_ = local_130 + 0x28;
  local_130._0_8_ = &local_68;
  local_130._24_8_ = &local_90;
  local_130._40_8_ = &local_a0;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Attribute(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<franca::AnnotationGenerator&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[13]>,0l>>,2l>const&,franca::TypeGenerator&>,2l>const&,boost::proto::exprns_::exp___t::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>>
            (local_158._8_8_);
  uVar3 = local_f0._8_8_;
  local_1b8 = pAVar1;
  local_1b0.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )(proto_child0)0x610d53;
  local_68 = &local_b8;
  local_1a8._8_8_ = " fireAndForget";
  local_188 = "    in";
  local_208 = (TypeGenerator *)local_1d8;
  local_130._24_8_ = &boost::spirit::buffer;
  local_a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_130 + 0x18);
  local_1f8 = &local_208;
  local_1f0.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_a8;
  local_a0 = "    error";
  local_90._M_allocated_capacity = (size_type)&local_a0;
  local_1d8._16_8_ = &local_1b8;
  local_1c0 = &boost::spirit::standard::string;
  local_b8 = (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Attribute_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
              *)CONCAT71(local_b8._1_7_,1);
  local_1e8 = (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)(local_1d8 + 0x10);
  local_1e0 = (TypeGenerator *)local_1a8;
  local_1d8._0_8_ = &local_1e8;
  local_90._8_8_ = 0x61a7d1;
  local_1d8._8_8_ = "\n  {\n";
  local_180 = (char *)local_178._8_8_;
  local_198._0_8_ = &boost::spirit::buffer;
  local_130._16_8_ = local_198;
  local_130._0_8_ = &boost::spirit::buffer;
  local_130._8_8_ = &local_90;
  local_130._40_8_ = "    out";
  local_130._48_8_ = local_178._8_8_;
  local_98.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )local_f0._8_8_;
  local_b0 = (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Version_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
              *)local_130;
  local_230 = (TypeGenerator *)&local_b0;
  local_228._M_string_length = 0x61cf86;
  local_238.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_1f8;
  local_228._M_dataplus._M_p = (pointer)&local_238;
  local_200.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )(local_130 + 0x10);
  local_1a8._0_8_ = &local_68;
  local_198._8_8_ = &local_188;
  local_130._32_8_ = local_130 + 0x28;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Method_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::define<_2b6eb72b_>(local_158._0_8_);
  local_1b8 = (AnnotationGenerator *)CONCAT71(local_1b8._1_7_,0x20);
  local_238.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_1b8;
  local_230 = (TypeGenerator *)&boost::spirit::standard::string;
  local_1e8 = (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)0x61cf59;
  local_1e0 = (TypeGenerator *)uVar2;
  local_1a8[0] = 10;
  local_1d8._0_8_ = &local_1e8;
  local_1d8._8_8_ = local_1a8;
  local_1d8._16_8_ = local_1d8;
  local_208 = (TypeGenerator *)0x61ced0;
  local_200.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(local_1d8 + 0x10);
  local_1f8 = &local_208;
  local_1f0.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)0x61cf4f;
  local_228._M_dataplus._M_p = (pointer)&local_238;
  local_228._M_string_length = (size_type)&local_1f8;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,boost::variant<std::__cxx11::string,std::vector<fidler::ast::Enumerator,std::allocator<fidler::ast::Enumerator>>>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[8]>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[7]>,0l>,boost::spirit::karma::rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Enumerator(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[6]>,0l>>,2l>const&>,2l>>
            (uVar3);
  local_238.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)0x610d85;
  local_230 = (TypeGenerator *)local_d8.members._0_8_;
  local_228._M_dataplus._M_p = &boost::spirit::standard::string;
  local_228._M_string_length = (size_type)&local_1f8;
  local_1f8 = (TypeGenerator **)&local_238;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Enumerator(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[4]>,0l>,franca::ExpressionGenerator&>,2l>const&>,1l>const&>,2l>>
            (uVar2);
  local_1d8._0_8_ = "  broadcast ";
  local_1e8 = (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)local_1a8;
  local_1e0 = (TypeGenerator *)0x610d96;
  local_1f8 = &local_208;
  local_1f0.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)0x61cec2;
  local_1b8 = (AnnotationGenerator *)0x610d73;
  local_228._M_string_length = 0x61cf86;
  local_1d8._8_8_ = &boost::spirit::standard::string;
  local_188._0_1_ = '\x01';
  local_1a8._0_8_ = &local_188;
  local_1b0.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )(expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
          )local_178._8_8_;
  local_1d8._16_8_ = &boost::spirit::buffer;
  local_238.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_1f8;
  local_230 = (TypeGenerator *)local_198;
  local_228._M_dataplus._M_p = (pointer)&local_238;
  local_208 = (TypeGenerator *)local_1d8;
  local_200.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_1e8;
  local_1c0 = (char *)&local_1b8;
  local_198._0_8_ = local_1d8 + 0x10;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Broadcast(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[13]>,0l>,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::___s_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[5]>,0l>>,2l>>
            (local_178._16_8_);
  uVar4 = local_d8._8_8_;
  uVar3 = local_f0._16_8_;
  uVar2 = local_140._0_8_;
  local_1e8 = (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)0x610da1;
  local_1e0 = (TypeGenerator *)local_140._0_8_;
  local_1a8[0] = 1;
  local_1b8 = (AnnotationGenerator *)local_1a8;
  local_1c0 = "[]";
  local_200.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&boost::spirit::standard::string;
  local_1f8 = &local_208;
  local_1f0.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)0x610d85;
  local_230 = (TypeGenerator *)local_d8._8_8_;
  local_228._M_string_length = (size_type)&boost::spirit::eol;
  local_238.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_1f8;
  local_228._M_dataplus._M_p = (pointer)&local_238;
  local_208 = (TypeGenerator *)local_1d8;
  local_1d8._0_8_ = &local_1e8;
  local_1d8._8_8_ = local_1d8 + 0x10;
  local_1d8._16_8_ = &local_1b8;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::ConstantDef(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[9]>,0l>,franca::TypeGenerator&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,boost::fusion::vector<bool>>>,0l>const&>,1l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[3]>,0l>>,2l>const&>,2l>const&,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[4]>,0l>>,2l>const&,franca::InitializerGenerator&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>>
            (local_178._0_8_);
  local_208 = (TypeGenerator *)0x61cf59;
  local_200.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )uVar3;
  local_1e8 = (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)CONCAT71(local_1e8._1_7_,10);
  local_1f8 = &local_208;
  local_238.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)0x61ced0;
  local_228._M_string_length = 0x61cf84;
  local_230 = (TypeGenerator *)local_1d8;
  local_228._M_dataplus._M_p = (pointer)&local_238;
  local_1f0.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_1e8;
  local_1d8._0_8_ = &local_1f8;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,std::vector<fidler::ast::Argument,std::allocator<fidler::ast::Argument>>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[8]>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::unary_plus,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[7]>,0l>,boost::spirit::karma::rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Argument(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[7]>,0l>>,2l>>
            (local_178._8_8_);
  local_1b8 = (AnnotationGenerator *)local_198;
  local_1f0.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_188;
  local_1d8._0_8_ = &local_1b8;
  local_1d8._8_8_ = "[]";
  local_208 = (TypeGenerator *)uVar2;
  local_1f8 = &local_208;
  local_230 = (TypeGenerator *)&boost::spirit::standard::string;
  local_1d8._16_8_ = " = ";
  local_1e8 = (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)&boost::spirit::buffer;
  local_1e0 = (TypeGenerator *)(local_1d8 + 0x10);
  local_228._M_string_length = (size_type)local_1a8;
  local_198[0] = 1;
  local_188 = (char *)CONCAT71(local_188._1_7_,0x20);
  local_1c0 = (char *)uVar4;
  local_238.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_1f8;
  local_228._M_dataplus._M_p = (pointer)&local_238;
  local_200.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )local_1d8;
  local_1a8._0_8_ = &local_1e8;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Argument(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<franca::TypeGenerator&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,boost::fusion::vector<bool>>>,0l>const&>,1l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[3]>,0l>>,2l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::buffer>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[4]>,0l>,franca::InitializerGenerator&>,2l>const&>,2l>const&>,1l>const&>,2l>>
            (uVar3);
  return;
}

Assistant:

ModelGenerator::ModelGenerator() :
		ModelGenerator::base_type(model_)
{
	namespace karma = boost::spirit::karma;

	model_
		%= "package "
		<< karma::string
		<< "\n"
		<< *import_
		<< *type_collection_
		<< *interface_
		;

	import_
		%= "import model from \""
		<< karma::string
		<< "\"\n"
		;

	type_collection_
		%= annotation_
		<< "typeCollection"
		<< -(' ' << karma::string)
		<< "\n{\n"
		<< -("  " << version_)
		<< *type_definition_
		<< *constant_def_
		<< "}\n"
		;

	interface_
		%= annotation_
		<< "interface "
		<< karma::string
		<< -(" extends " << karma::string)
		<< -karma::buffer[" manages " << (karma::string % ", ")]
		<< "\n{\n"
		<< -version_
		<< *attribute_
		<< *method_
		<< *broadcast_
		<< -contract_
		<< *type_definition_
		<< *constant_def_
		<< "}\n"
		;

	version_
		%= "  version { major "
		<< karma::int_
		<< " minor "
		<< karma::int_
		<< " }\n"
		;

	attribute_
		%= annotation_
		<< "  attribute "
		<< type_
		<< (!karma::bool_(true) | "[]")
		<< ' '
		<< karma::string
		<< (!karma::bool_(true) | " readonly")
		<< (!karma::bool_(true) | " noSubscriptions")
		<< karma::eol
		;

	method_
		%= annotation_
		<< "  method "
		<< karma::string
		<< (!karma::bool_(true) | " fireAndForget")
		<< "\n  {\n"
		<< -karma::buffer["    in" << argument_list_]
		<< -karma::buffer["    out" << argument_list_]
		<< -karma::buffer["    error" << error_ << "\n"]
		<< "  }\n"
		;

	error_
		%= (' ' << karma::string)
		| ("\n    {\n" << *("      " << enumerator_ << '\n') << "    }")
		;

	enumerator_
		%= karma::string
		<< -(" = " << expression_)
		;

	broadcast_
		%= "  broadcast "
		<< karma::string
		<< (!karma::bool_(true) | " selective")
		<< "\n  {\n"
		<< -karma::buffer["    out" << argument_list_]
		<< "  }\n"
		;

	constant_def_
		%= "  const "
		<< type_
		<< (!karma::bool_(true) | "[]")
		<< karma::string
		<< " = "
		<< initializer_
		<< karma::eol
		;

	argument_list_
		%= "\n    {\n"
		<< +("      " << argument_ << '\n')
		<< "    }\n"
		;

	argument_
		%= type_
		<< (!karma::bool_(true) | "[]")
		<< ' '
		<< karma::string
		<< -karma::buffer[" = " << initializer_]
		;
}